

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::bean_ptr<B>::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>>
          (bean_ptr<B> *this,AVisitor<hiberlite::KillChildren> *ar)

{
  AVisitor<hiberlite::KillChildren> *this_00;
  bool bVar1;
  bool bVar2;
  sqlid_t sVar3;
  real_bean<B> *this_01;
  logic_error *this_02;
  undefined1 local_130 [40];
  bean_ptr<B> local_108;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  sql_nvp<long_long> local_a0;
  byte local_55;
  undefined1 local_48 [31];
  byte local_29;
  AVisitor<hiberlite::KillChildren> *local_18;
  AVisitor<hiberlite::KillChildren> *ar_local;
  bean_ptr<B> *this_local;
  
  local_18 = ar;
  ar_local = (AVisitor<hiberlite::KillChildren> *)this;
  sVar3 = get_id(this);
  this->tmp_id = sVar3;
  local_29 = 0;
  local_55 = 0;
  bVar1 = false;
  if (this->tmp_id != -1) {
    AVisitor<hiberlite::KillChildren>::getConnection
              ((AVisitor<hiberlite::KillChildren> *)&stack0xffffffffffffffd8);
    local_29 = 1;
    bVar1 = shared_res::operator_cast_to_bool((shared_res *)&stack0xffffffffffffffd8);
    this_01 = shared_res<hiberlite::real_bean<B>_>::get_object
                        (&this->super_shared_res<hiberlite::real_bean<B>_>);
    real_bean<B>::get_key((bean_key *)local_48,this_01);
    local_55 = 1;
    bVar2 = shared_res::operator_cast_to_bool((shared_res *)(local_48 + 8));
    bVar1 = bVar1 != bVar2;
  }
  if ((local_55 & 1) != 0) {
    bean_key::~bean_key((bean_key *)local_48);
  }
  if ((local_29 & 1) != 0) {
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)&stack0xffffffffffffffd8);
  }
  this_00 = local_18;
  if (bVar1) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"saving the bean from different database");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"id",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  sql_nvp<long_long>::sql_nvp(&local_a0,(string *)local_c0,&this->tmp_id,(string *)local_e8);
  AVisitor<hiberlite::KillChildren>::operator&(this_00,&local_a0);
  sql_nvp<long_long>::~sql_nvp(&local_a0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  bVar1 = AVisitor<hiberlite::KillChildren>::is_loading(local_18);
  if (bVar1) {
    AVisitor<hiberlite::KillChildren>::getConnection((AVisitor<hiberlite::KillChildren> *)local_130)
    ;
    bean_key::bean_key((bean_key *)(local_130 + 0x10),(shared_connection *)local_130,this->tmp_id);
    Registry<B>::get(&local_108,(bean_key *)(local_130 + 0x10));
    operator=(this,&local_108);
    ~bean_ptr(&local_108);
    bean_key::~bean_key((bean_key *)(local_130 + 0x10));
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)local_130);
  }
  return;
}

Assistant:

void bean_ptr<C>::hibernate(Archive & ar)
{
	tmp_id=get_id();

	if(tmp_id!=Database::NULL_ID
			&& ar.getConnection()!=shared_res< real_bean<C> >::get_object()->get_key().con)
		throw std::logic_error("saving the bean from different database");

	ar & hiberlite::sql_nvp< sqlid_t > ("id", tmp_id );
	if(ar.is_loading())
		*this=Registry<C>::get( bean_key(ar.getConnection(), tmp_id) );
}